

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

int __thiscall minihttp::TcpSocket::open(TcpSocket *this,char *__file,int __oflag,...)

{
  addrinfo *__ai;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined7 extraout_var;
  string *__rhs;
  addrinfo *local_80;
  sockaddr local_78;
  char port_str [16];
  addrinfo hnt;
  
  if (this->_s == -1) goto LAB_0010799b;
  __rhs = (string *)__file;
  if (__file == (char *)0x0) {
LAB_00107980:
    iVar2 = (int)__rhs;
    iVar3 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    if (__oflag == 0) {
      return iVar3;
    }
    if (this->_lastport == __oflag) {
      return iVar3;
    }
  }
  else {
    __rhs = &this->_host;
    bVar1 = std::operator!=(__file,__rhs);
    iVar2 = (int)__rhs;
    in_RAX = CONCAT71(extraout_var,bVar1);
    if (!bVar1) goto LAB_00107980;
  }
  close(this,iVar2);
LAB_0010799b:
  if (__file == (char *)0x0) {
    __file = (this->_host)._M_dataplus._M_p;
  }
  else {
    std::__cxx11::string::assign((char *)&this->_host);
  }
  if (__oflag == 0) {
    __oflag = this->_lastport;
    if (__oflag == 0) {
      return 0;
    }
  }
  else {
    this->_lastport = __oflag;
  }
  if (this->_s == -1) {
    this->_recvSize = 0;
    sprintf(port_str,"%u",(ulong)(uint)__oflag);
    local_80 = (addrinfo *)0x0;
    hnt.ai_flags = 0;
    hnt.ai_protocol = 0;
    hnt.ai_addrlen = 0;
    hnt._20_4_ = 0;
    hnt.ai_addr = (sockaddr *)0x0;
    hnt.ai_canonname = (char *)0x0;
    hnt.ai_next = (addrinfo *)0x0;
    hnt.ai_family = 2;
    hnt.ai_socktype = 1;
    iVar2 = getaddrinfo(__file,port_str,(addrinfo *)&hnt,&local_80);
    __ai = local_80;
    if ((iVar2 == 0) && (local_80 != (addrinfo *)0x0)) {
      if (local_80->ai_family == 2) {
        memcpy(&local_78,local_80->ai_addr,(ulong)local_80->ai_addrlen);
        freeaddrinfo(__ai);
        iVar2 = socket(2,1,0);
        if ((iVar2 != -1) && (iVar3 = connect(iVar2,&local_78,0x10), iVar3 == 0)) {
          this->_s = (long)iVar2;
          _SetNonBlocking((long)iVar2,this->_nonblocking);
          iVar2 = (*this->_vptr_TcpSocket[7])(this);
          return (int)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
        }
      }
      else {
        freeaddrinfo(local_80);
      }
    }
    return 0;
  }
  __assert_fail("!SOCKETVALID(_s)",
                "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                ,0x204,"bool minihttp::TcpSocket::open(const char *, unsigned int)");
}

Assistant:

bool TcpSocket::open(const char *host /* = NULL */, unsigned int port /* = 0 */)
{
    if(isOpen())
    {
        if( (host && host != _host) || (port && port != _lastport) )
            close();
            // ... and continue connecting to new host/port
        else
            return true; // still connected, to same host and port.
    }

    if(host)
        _host = host;
    else
        host = _host.c_str();

    if(port)
        _lastport = port;
    else
    {
        port = _lastport;
        if(!port)
            return false;
    }

    traceprint("TcpSocket::open(): host = [%s], port = %d\n", host, port);

    assert(!SOCKETVALID(_s));

    _recvSize = 0;

    {
        SOCKET s;
        if(!_openSocket(&s, host, port))
            return false;
        _s = s;

#ifdef SO_NOSIGPIPE
        // Don't fire SIGPIPE when trying to write to a closed socket
        {
            int set = 1;
            setsockopt(s, SOL_SOCKET, SO_NOSIGPIPE, (void *)&set, sizeof(int));
        }
#endif

    }

    _SetNonBlocking(_s, _nonblocking); // restore setting if it was set in invalid state. static call because _s is intentionally still invalid here.

#ifdef MINIHTTP_USE_MBEDTLS
    if(_sslctx)
    {
        traceprint("TcpSocket::open(): SSL requested...\n");
        if(!_openSSL(&_s, (SSLCtx*)_sslctx))
        {
            close();
            return false;
        }
    }
#endif

    _OnOpen();

    return true;
}